

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

int fio_thread_join(void *p_thr)

{
  void *p_thr_local;
  
  if ((p_thr == (void *)0x0) || (*p_thr == 0)) {
    p_thr_local._4_4_ = -1;
  }
  else {
    pthread_join(*p_thr,(void **)0x0);
    *(undefined8 *)p_thr = 0;
    free(p_thr);
    p_thr_local._4_4_ = 0;
  }
  return p_thr_local._4_4_;
}

Assistant:

int __attribute__((weak)) fio_thread_join(void *p_thr) {
  if (!p_thr || !(*((pthread_t *)p_thr)))
    return -1;
  pthread_join(*((pthread_t *)p_thr), NULL);
  *((pthread_t *)p_thr) = (pthread_t)NULL;
  free(p_thr);
  return 0;
}